

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_openssl.c
# Opt level: O0

ssize_t amqp_ssl_socket_writev(void *base,iovec *iov,int iovcnt)

{
  void *pvVar1;
  ssize_t sVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  size_t bytes;
  char *bufferp;
  ssize_t ret;
  amqp_ssl_socket_t *self;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  void *buf;
  
  buf = (void *)0x0;
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    buf = (void *)(*(long *)(in_RSI + (long)iVar3 * 0x10 + 8) + (long)buf);
  }
  if (*(void **)(in_RDI + 0x28) < buf) {
    pvVar1 = realloc(*(void **)(in_RDI + 0x20),(size_t)buf);
    *(void **)(in_RDI + 0x20) = pvVar1;
    if (*(long *)(in_RDI + 0x20) == 0) {
      *(undefined8 *)(in_RDI + 0x28) = 0;
      return -1;
    }
    *(void **)(in_RDI + 0x28) = buf;
  }
  pvVar1 = *(void **)(in_RDI + 0x20);
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    memcpy(pvVar1,*(void **)(in_RSI + (long)iVar3 * 0x10),
           *(size_t *)(in_RSI + (long)iVar3 * 0x10 + 8));
    pvVar1 = (void *)(*(long *)(in_RSI + (long)iVar3 * 0x10 + 8) + (long)pvVar1);
  }
  sVar2 = amqp_ssl_socket_send(pvVar1,buf,CONCAT44(iVar3,in_stack_ffffffffffffffc0));
  return sVar2;
}

Assistant:

static ssize_t
amqp_ssl_socket_writev(void *base,
                       struct iovec *iov,
                       int iovcnt)
{
  struct amqp_ssl_socket_t *self = (struct amqp_ssl_socket_t *)base;
  ssize_t ret = -1;
  char *bufferp;
  size_t bytes;
  int i;
  bytes = 0;
  for (i = 0; i < iovcnt; ++i) {
    bytes += iov[i].iov_len;
  }
  if (self->length < bytes) {
    self->buffer = realloc(self->buffer, bytes);
    if (!self->buffer) {
      self->length = 0;
      ret = AMQP_STATUS_NO_MEMORY;
      goto exit;
    }
    self->length = bytes;
  }
  bufferp = self->buffer;
  for (i = 0; i < iovcnt; ++i) {
    memcpy(bufferp, iov[i].iov_base, iov[i].iov_len);
    bufferp += iov[i].iov_len;
  }
  ret = amqp_ssl_socket_send(self, self->buffer, bytes);
exit:
  return ret;
}